

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O2

void __thiscall
UtestShell::assertEquals
          (UtestShell *this,bool failed,char *expected,char *actual,char *text,char *file,int line,
          TestTerminator *testTerminator)

{
  TestResult *pTVar1;
  undefined7 in_register_00000031;
  SimpleString local_88;
  SimpleString local_80;
  SimpleString local_78;
  TestFailure local_70;
  
  pTVar1 = getTestResult(this);
  (*pTVar1->_vptr_TestResult[10])(pTVar1);
  if ((int)CONCAT71(in_register_00000031,failed) != 0) {
    SimpleString::SimpleString(&local_80,expected);
    SimpleString::SimpleString(&local_88,actual);
    SimpleString::SimpleString(&local_78,text);
    CheckEqualFailure::CheckEqualFailure
              ((CheckEqualFailure *)&local_70,this,file,line,&local_80,&local_88,&local_78);
    (*this->_vptr_UtestShell[0x25])(this,&local_70,testTerminator);
    TestFailure::~TestFailure(&local_70);
    SimpleString::~SimpleString(&local_78);
    SimpleString::~SimpleString(&local_88);
    SimpleString::~SimpleString(&local_80);
  }
  return;
}

Assistant:

void UtestShell::assertEquals(bool failed, const char* expected, const char* actual, const char* text, const char* file, int line, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (failed)
        failWith(CheckEqualFailure(this, file, line, expected, actual, text), testTerminator);
}